

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O1

void __thiscall QStyleSheetStyle::unpolish(QStyleSheetStyle *this,QApplication *app)

{
  QStyleSheetStyle *pQVar1;
  QStyle *pQVar2;
  long in_FS_OFFSET;
  void *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = baseStyle(this);
  (**(code **)(*(long *)pQVar2 + 0x78))(pQVar2,app);
  pQVar1 = globalStyleSheetStyle;
  if (globalStyleSheetStyle == (QStyleSheetStyle *)0x0 ||
      globalStyleSheetStyle == (QStyleSheetStyle *)this) {
    if (globalStyleSheetStyle == (QStyleSheetStyle *)0x0) {
      globalStyleSheetStyle = (QStyleSheetStyle *)this;
    }
    QHash<const_QObject_*,_QList<QCss::StyleRule>_>::clear(&styleSheetCaches->styleRulesCache);
    QHash<const_QObject_*,_QHash<int,_bool>_>::clear(&styleSheetCaches->hasStyleRuleCache);
    QHash<const_QObject_*,_QHash<int,_QHash<unsigned_long_long,_QRenderRule>_>_>::clear
              (&styleSheetCaches->renderRulesCache);
    local_20 = QCoreApplication::self;
    QHash<void_const*,QCss::StyleSheet>::removeImpl<void_const*>
              ((QHash<void_const*,QCss::StyleSheet> *)&styleSheetCaches->styleSheetCache,&local_20);
    if (pQVar1 == (QStyleSheetStyle *)0x0) {
      globalStyleSheetStyle = (QStyleSheetStyle *)0x0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QStyleSheetStyle::unpolish(QApplication *app)
{
    baseStyle()->unpolish(app);
    RECURSION_GUARD(return)
    styleSheetCaches->styleRulesCache.clear();
    styleSheetCaches->hasStyleRuleCache.clear();
    styleSheetCaches->renderRulesCache.clear();
    styleSheetCaches->styleSheetCache.remove(qApp);
}